

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

kd_tree_data_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,784ul>
::operator()(build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_784UL>
             *this,space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
                   space,splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *param_5)

{
  node_type *pnVar1;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  kd_tree_data_type *in_RDI;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *in_R8;
  node_type *root_node;
  node_allocator_type allocator;
  box_type root_box;
  vector<int,_std::allocator<int>_> indices;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffe668;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffe670;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe678;
  allocator_type *in_stack_ffffffffffffe680;
  vector<int,_std::allocator<int>_> *this_00;
  kd_tree_data_type *pkVar2;
  kd_tree_data_type *this_01;
  build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_784UL>
  local_18f0 [6120];
  box_type *in_stack_fffffffffffffef8;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
  *in_stack_ffffffffffffff00;
  vector<int,_std::allocator<int>_> local_48;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *local_28;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *local_20;
  undefined8 local_10;
  
  this_01 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RDX;
  space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>::size
            ((space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
              *)0x10e81e);
  std::allocator<int>::allocator((allocator<int> *)0x10e835);
  std::vector<int,_std::allocator<int>_>::vector
            (&this_01->indices,(size_type)in_RDI,in_stack_ffffffffffffe680);
  std::allocator<int>::~allocator((allocator<int> *)0x10e85b);
  this_00 = &local_48;
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe668._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe668._M_current);
  ::std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_ffffffffffffe670,in_stack_ffffffffffffe668,0);
  splitter_start_bounds_t<pico_tree::bounds_from_space_t>::derived(local_28);
  box_from_bounds<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>>
            (local_18f0,in_RSI,local_10);
  chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::chunk_allocator
            ((chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL> *)
             in_stack_ffffffffffffe670._M_current);
  splitter_stop_condition_t<pico_tree::max_leaf_size_t>::derived(local_20);
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
  ::build_kd_tree_impl
            ((build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
              *)this_01,(space_type *)in_RDI,(size_type)this_00,in_stack_ffffffffffffe678,
             (node_allocator_type *)in_stack_ffffffffffffe670._M_current);
  pnVar1 = build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
           ::operator()(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  pkVar2 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            (&in_RDI->indices,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe668._M_current);
  memcpy(&pkVar2->root_box,local_18f0,0x1880);
  chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::chunk_allocator
            ((chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL> *)
             in_RDI,(chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>
                     *)in_stack_ffffffffffffe668._M_current);
  pkVar2->root_node = pnVar1;
  chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::
  ~chunk_allocator((chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>
                    *)0x10e99f);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return this_01;
}

Assistant:

kd_tree_data_type operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const&) {
    static_assert(
        std::is_same_v<scalar_type, typename SpaceWrapper_::scalar_type>);
    static_assert(Dim_ == SpaceWrapper_::dim);
    assert(space.size() > 0);

    using build_kd_tree_impl_type =
        build_kd_tree_impl<SpaceWrapper_, Stop_, Rule_, kd_tree_data_type>;
    using node_allocator_type = typename kd_tree_data_type::node_allocator_type;

    std::vector<index_type> indices(space.size());
    std::iota(indices.begin(), indices.end(), 0);
    box_type root_box = box_from_bounds(space, start_bounds.derived());
    node_allocator_type allocator;
    node_type* root_node = build_kd_tree_impl_type{
        space, stop_condition.derived().value, indices, allocator}(root_box);

    return kd_tree_data_type{
        std::move(indices), root_box, std::move(allocator), root_node};
  }